

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O0

int nghttp2_session_set_stream_user_data
              (nghttp2_session *session,int32_t stream_id,void *stream_user_data)

{
  nghttp2_outbound_item *pnVar1;
  int iVar2;
  nghttp2_stream *pnVar3;
  nghttp2_outbound_item *local_40;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_stream *stream;
  void *stream_user_data_local;
  int32_t stream_id_local;
  nghttp2_session *session_local;
  
  pnVar3 = nghttp2_session_get_stream(session,stream_id);
  if (pnVar3 == (nghttp2_stream *)0x0) {
    if (((session->server == '\0') &&
        (iVar2 = nghttp2_session_is_my_stream_id(session,stream_id), iVar2 != 0)) &&
       ((session->ob_syn).head != (nghttp2_outbound_item *)0x0)) {
      pnVar1 = (session->ob_syn).head;
      if ((pnVar1->frame).hd.type != '\x01') {
        __assert_fail("frame->hd.type == NGHTTP2_HEADERS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                      ,0x1eb8,
                      "int nghttp2_session_set_stream_user_data(nghttp2_session *, int32_t, void *)"
                     );
      }
      if ((stream_id < (pnVar1->frame).hd.stream_id) || (session->next_stream_id <= (uint)stream_id)
         ) {
        session_local._4_4_ = -0x1f5;
      }
      else {
        for (local_40 = (session->ob_syn).head; local_40 != (nghttp2_outbound_item *)0x0;
            local_40 = local_40->qnext) {
          if (stream_id <= (local_40->frame).hd.stream_id) {
            if ((local_40->frame).hd.stream_id <= stream_id) {
              (local_40->aux_data).headers.stream_user_data = stream_user_data;
              return 0;
            }
            break;
          }
        }
        session_local._4_4_ = -0x1f5;
      }
    }
    else {
      session_local._4_4_ = -0x1f5;
    }
  }
  else {
    pnVar3->stream_user_data = stream_user_data;
    session_local._4_4_ = 0;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_session_set_stream_user_data(nghttp2_session *session,
                                         int32_t stream_id,
                                         void *stream_user_data) {
  nghttp2_stream *stream;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;

  stream = nghttp2_session_get_stream(session, stream_id);
  if (stream) {
    stream->stream_user_data = stream_user_data;
    return 0;
  }

  if (session->server || !nghttp2_session_is_my_stream_id(session, stream_id) ||
      !nghttp2_outbound_queue_top(&session->ob_syn)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  frame = &nghttp2_outbound_queue_top(&session->ob_syn)->frame;
  assert(frame->hd.type == NGHTTP2_HEADERS);

  if (frame->hd.stream_id > stream_id ||
      (uint32_t)stream_id >= session->next_stream_id) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (item = session->ob_syn.head; item; item = item->qnext) {
    if (item->frame.hd.stream_id < stream_id) {
      continue;
    }

    if (item->frame.hd.stream_id > stream_id) {
      break;
    }

    item->aux_data.headers.stream_user_data = stream_user_data;
    return 0;
  }

  return NGHTTP2_ERR_INVALID_ARGUMENT;
}